

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O2

vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> * xmrig::OclPlatform::get(void)

{
  vector<xmrig::OclPlatform,std::allocator<xmrig::OclPlatform>> *in_RDI;
  vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> platforms;
  ulong local_30;
  _Vector_base<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> local_28;
  
  OclLib::getPlatformIDs();
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  if (local_28._M_impl.super__Vector_impl_data._M_start !=
      local_28._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::reserve
              ((vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)in_RDI,
               (long)local_28._M_impl.super__Vector_impl_data._M_finish -
               (long)local_28._M_impl.super__Vector_impl_data._M_start >> 3);
    local_30 = 0;
    while( true ) {
      if ((ulong)((long)local_28._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_28._M_impl.super__Vector_impl_data._M_start >> 3) <= local_30) break;
      std::vector<xmrig::OclPlatform,std::allocator<xmrig::OclPlatform>>::
      emplace_back<unsigned_long&,_cl_platform_id*const&>
                (in_RDI,&local_30,local_28._M_impl.super__Vector_impl_data._M_start + local_30);
      local_30 = local_30 + 1;
    }
  }
  std::_Vector_base<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>::~_Vector_base(&local_28)
  ;
  return (vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)in_RDI;
}

Assistant:

std::vector<xmrig::OclPlatform> xmrig::OclPlatform::get()
{
    const std::vector<cl_platform_id> platforms = OclLib::getPlatformIDs();
    std::vector<OclPlatform> out;
    if (platforms.empty()) {
        return out;
    }

    out.reserve(platforms.size());

    for (size_t i = 0; i < platforms.size(); i++) {
        out.emplace_back(i, platforms[i]);
    }

    return out;
}